

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_mem_ExecutableBlockArena.cpp
# Opt level: O0

void * axl::mem::allocateExecutablePages(size_t size)

{
  void *pvVar1;
  size_t in_RDI;
  void *pages;
  
  pvVar1 = mmap((void *)0x0,in_RDI,7,0x22,-1,0);
  if (pvVar1 == (void *)0x0) {
    err::setLastSystemError();
  }
  return pvVar1;
}

Assistant:

void*
allocateExecutablePages(size_t size) {
	void* pages = ::mmap(
		NULL,
		size,
		PROT_EXEC | PROT_READ | PROT_WRITE,
		MAP_PRIVATE | MAP_ANON,
		-1,
		0
	);

	if (!pages)
		err::setLastSystemError();

	return pages;
}